

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_chunk_split(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  int nSepLen;
  long local_40;
  int nLen;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jx9_result_null(pCtx);
    return 0;
  }
  nSepLen = 2;
  pcVar2 = jx9_value_to_string(*apArg,&nLen);
  pcVar7 = "\r\n";
  uVar5 = 2;
  if (nArg == 1) {
    uVar4 = 0x4c;
    lVar3 = (long)nLen;
  }
  else {
    local_40 = (long)nLen;
    uVar1 = jx9_value_to_int(apArg[1]);
    uVar4 = 0x4c;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    if (2 < (uint)nArg) {
      pcVar6 = jx9_value_to_string(apArg[2],&nSepLen);
      if (0 < nSepLen) {
        uVar5 = (ulong)(uint)nSepLen;
        lVar3 = local_40;
        pcVar7 = pcVar6;
        goto LAB_0012a679;
      }
      nSepLen = 2;
    }
    uVar5 = 2;
    lVar3 = local_40;
  }
LAB_0012a679:
  if (nLen < (int)uVar4) {
    jx9_result_string_format(pCtx,"%.*s%.*s",(ulong)(uint)nLen,pcVar2,uVar5,pcVar7);
  }
  else {
    pcVar6 = pcVar2 + lVar3;
    for (; pcVar2 < pcVar6; pcVar2 = pcVar2 + (int)uVar4) {
      uVar1 = (int)pcVar6 - (int)pcVar2;
      if ((int)uVar1 <= (int)uVar4) {
        uVar4 = (ulong)uVar1;
      }
      jx9_result_string_format(pCtx,"%.*s%.*s",uVar4,pcVar2,(ulong)(uint)nSepLen,pcVar7);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_chunk_split(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zEnd, *zSep = "\r\n";
	int nSepLen, nChunkLen, nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Nothing to split, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* initialize/Extract arguments */
	nSepLen = (int)sizeof("\r\n") - 1;
	nChunkLen = 76;
	zIn = jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	if( nArg > 1 ){
		/* Chunk length */
		nChunkLen = jx9_value_to_int(apArg[1]);
		if( nChunkLen < 1 ){
			/* Switch back to the default length */
			nChunkLen = 76;
		}
		if( nArg > 2 ){
			/* Separator */
			zSep = jx9_value_to_string(apArg[2], &nSepLen);
			if( nSepLen < 1 ){
				/* Switch back to the default separator */
				zSep = "\r\n";
				nSepLen = (int)sizeof("\r\n") - 1;
			}
		}
	}
	/* Perform the requested operation */
	if( nChunkLen > nLen ){
		/* Nothing to split, return the string and the separator */
		jx9_result_string_format(pCtx, "%.*s%.*s", nLen, zIn, nSepLen, zSep);
		return JX9_OK;
	}
	while( zIn < zEnd ){
		if( nChunkLen > (int)(zEnd-zIn) ){
			nChunkLen = (int)(zEnd - zIn);
		}
		/* Append the chunk and the separator */
		jx9_result_string_format(pCtx, "%.*s%.*s", nChunkLen, zIn, nSepLen, zSep);
		/* Point beyond the chunk */
		zIn += nChunkLen;
	}
	return JX9_OK;
}